

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve448.c
# Opt level: O0

int recode_wnaf(smvt_control *control,curve448_scalar_s *scalar,uint table_bits)

{
  int iVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  int32_t delta;
  uint32_t odd;
  uint32_t pos;
  uint i;
  uint n;
  uint B_OVER_16;
  uint w;
  uint32_t mask;
  uint64_t current;
  int position;
  uint table_size;
  uint table_bits_local;
  curve448_scalar_s *scalar_local;
  smvt_control *control_local;
  
  iVar3 = (int)(0x1be / (ulong)(table_bits + 1));
  current = scalar->limb[0] & 0xffff;
  cVar2 = (char)table_bits;
  control[iVar3 + 2].power = -1;
  control[iVar3 + 2].addend = 0;
  position = iVar3 + 1;
  for (w = 1; w < 0x1e; w = w + 1) {
    if (w < 0x1c) {
      current = (scalar->limb[w >> 2] >> (sbyte)((w & 3) << 4) & 0xffff) * 0x10000 + current;
    }
    while ((current & 0xffff) != 0) {
      iVar1 = 0;
      for (uVar4 = (uint)current; (uVar4 & 1) == 0; uVar4 = uVar4 >> 1 | 0x80000000) {
        iVar1 = iVar1 + 1;
      }
      uVar4 = (uint)current >> ((byte)iVar1 & 0x1f);
      delta = uVar4 & (1 << (cVar2 + 1U & 0x1f)) - 1U;
      if ((uVar4 & 1 << (cVar2 + 1U & 0x1f)) != 0) {
        delta = delta - (1 << (cVar2 + 1U & 0x1f));
      }
      current = current - (long)(delta * (1 << ((byte)iVar1 & 0x1f)));
      control[position].power = iVar1 + (w - 1) * 0x10;
      control[position].addend = delta;
      position = position + -1;
    }
    current = current >> 0x10;
  }
  uVar4 = (iVar3 + 3) - (position + 1);
  for (i = 0; i < uVar4; i = i + 1) {
    control[i] = control[i + position + 1];
  }
  return uVar4 - 1;
}

Assistant:

static int recode_wnaf(struct smvt_control *control,
                       /* [nbits/(table_bits + 1) + 3] */
                       const curve448_scalar_t scalar,
                       unsigned int table_bits)
{
    unsigned int table_size = C448_SCALAR_BITS / (table_bits + 1) + 3;
    int position = table_size - 1; /* at the end */
    uint64_t current = scalar->limb[0] & 0xFFFF;
    uint32_t mask = (1 << (table_bits + 1)) - 1;
    unsigned int w;
    const unsigned int B_OVER_16 = sizeof(scalar->limb[0]) / 2;
    unsigned int n, i;

    /* place the end marker */
    control[position].power = -1;
    control[position].addend = 0;
    position--;

    /*
     * PERF: Could negate scalar if it's large.  But then would need more cases
     * in the actual code that uses it, all for an expected reduction of like
     * 1/5 op. Probably not worth it.
     */

    for (w = 1; w < (C448_SCALAR_BITS - 1) / 16 + 3; w++) {
        if (w < (C448_SCALAR_BITS - 1) / 16 + 1) {
            /* Refill the 16 high bits of current */
            current += (uint32_t)((scalar->limb[w / B_OVER_16]
                       >> (16 * (w % B_OVER_16))) << 16);
        }

        while (current & 0xFFFF) {
            uint32_t pos = NUMTRAILINGZEROS((uint32_t)current);
            uint32_t odd = (uint32_t)current >> pos;
            int32_t delta = odd & mask;

            assert(position >= 0);
            if (odd & (1 << (table_bits + 1)))
                delta -= (1 << (table_bits + 1));
            current -= delta * (1 << pos);
            control[position].power = pos + 16 * (w - 1);
            control[position].addend = delta;
            position--;
        }
        current >>= 16;
    }
    assert(current == 0);

    position++;
    n = table_size - position;
    for (i = 0; i < n; i++)
        control[i] = control[i + position];

    return n - 1;
}